

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h263d_parser.c
# Opt level: O0

MPP_RET mpp_h263_parser_setup_syntax(H263dParser ctx,MppSyntax *syntax)

{
  DXVA_PicParams_H263 *pp;
  h263d_dxva2_picture_context_t *syn;
  H263dParserImpl *p;
  MppSyntax *syntax_local;
  H263dParser ctx_local;
  
  pp = *(DXVA_PicParams_H263 **)((long)ctx + 0xa8);
  if ((h263d_debug & 1) != 0) {
    _mpp_log_l(4,(char *)0x0,"in\n","mpp_h263_parser_setup_syntax");
  }
  h263d_fill_picture_parameters((H263dParserImpl *)ctx,pp);
  *(undefined4 *)(*(long *)&pp[1].vop_time_increment_resolution + 0xc) =
       *(undefined4 *)(*(long *)((long)ctx + 0x30) + 0x40);
  *(undefined4 *)(*(long *)&pp[1].vop_time_increment_resolution + 8) =
       *(undefined4 *)((long)ctx + 0x60);
  *(undefined8 *)(*(long *)&pp[1].vop_time_increment_resolution + 0x28) =
       *(undefined8 *)(*(long *)((long)ctx + 0x30) + 0x38);
  syntax->number = 2;
  syntax->data = &pp[1].wDecodedPictureIndex;
  if ((h263d_debug & 1) != 0) {
    _mpp_log_l(4,(char *)0x0,"out\n","mpp_h263_parser_setup_syntax");
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_h263_parser_setup_syntax(H263dParser ctx, MppSyntax *syntax)
{
    H263dParserImpl *p = (H263dParserImpl *)ctx;
    h263d_dxva2_picture_context_t *syn = p->syntax;

    h263d_dbg_func("in\n");

    h263d_fill_picture_parameters(p, &syn->pp);

    // fill bit stream parameter
    syn->data[1]->DataSize   = p->bit_ctx->buf_len;
    syn->data[1]->DataOffset = p->hdr_curr.hdr_bits;
    syn->data[1]->pvPVPState = p->bit_ctx->buf;

    syntax->number = 2;
    syntax->data = syn->data;

    h263d_dbg_func("out\n");

    return MPP_OK;
}